

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snestistics.cpp
# Opt level: O2

void __thiscall
data_report(ReportWriter&,snestistics::Trace_const&,snestistics::
AnnotationResolver_const&,bool,bool)::AccessIterator::emit(snestistics::StringBuilder__
          (void *this,StringBuilder *sb)

{
  ulong uVar1;
  _Self __tmp;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar4 = (ulong)*(uint *)((long)this + 0x10);
  uVar1 = *(ulong *)(*this + 0x28);
  if (uVar4 < uVar1) {
    p_Var2 = *(_Rb_tree_node_base **)(*this + 0x18);
    while (iVar3 = (int)uVar4, uVar4 = (ulong)(iVar3 - 1), iVar3 != 0) {
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    }
    snestistics::StringBuilder::format(sb,"%s",*(undefined8 *)(*(long *)(p_Var2 + 1) + 8));
    return;
  }
  iVar3 = *(uint *)((long)this + 0x10) - (int)uVar1;
  p_Var2 = *(_Rb_tree_node_base **)(*(long *)((long)this + 8) + 0x18);
  while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  snestistics::StringBuilder::format(sb,"%06X",(ulong)p_Var2[1]._M_color);
  return;
}

Assistant:

void emit(StringBuilder &sb) {
				if (_current < _known.size()) {
					auto it = _known.begin();
					for (uint32_t i=0; i<_current; i++, it++);
					const Annotation *a = *it;
					sb.format("%s", a->name.c_str());
				} else {
					uint32_t lc = _current - (uint32_t)_known.size();
					auto it = _unknown.begin();
					for (uint32_t i=0; i<lc; i++, it++);
					const uint32_t pc = *it;
					sb.format("%06X", pc);
				}
			}